

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_value_pointer_bug_t.c
# Opt level: O0

void run_tests(int mode,char *mode_desc)

{
  char *db_file;
  MMDB_s *mmdb_00;
  MMDB_s *mmdb;
  char *path;
  char *filename;
  char *mode_desc_local;
  int mode_local;
  
  db_file = test_database_path("GeoIP2-City-Test.mmdb");
  mmdb_00 = open_ok(db_file,mode,mode_desc);
  free(db_file);
  test_one_ip(mmdb_00,"GeoIP2-City-Test.mmdb",mode_desc,"2001:218::","JP");
  test_one_ip(mmdb_00,"GeoIP2-City-Test.mmdb",mode_desc,"81.2.69.160","GB");
  MMDB_close(mmdb_00);
  free(mmdb_00);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "GeoIP2-City-Test.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    /* This exercises a bug where the entire top-level value is a pointer to
     * another part of the data section. */
    test_one_ip(mmdb, filename, mode_desc, "2001:218::", "JP");
    /* This exercises a bug where one subnet's data shares part of the data
     * with another subnet - in this case it is the "country" key (and others)
     * in the top level map. We are testing that the "country" key's value is
     * handled correctly. The value _should_ be a pointer to another map. */
    test_one_ip(mmdb, filename, mode_desc, "81.2.69.160", "GB");

    MMDB_close(mmdb);
    free(mmdb);
}